

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

int Internal_CompareQuartetNameEtc(ON_Font **lhs,ON_Font **rhs)

{
  int iVar1;
  
  iVar1 = ON_FontList::CompareQuartetName(lhs,rhs);
  if (iVar1 == 0) {
    iVar1 = ON_FontList::CompareWeightStretchStyle(lhs,rhs);
    if (iVar1 == 0) {
      iVar1 = ON_FontList::CompareUnderlinedStrikethroughPointSize(lhs,rhs);
      if (iVar1 == 0) {
        iVar1 = ON_FontList::CompareFontCharacteristicsHash(lhs,rhs);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

static int Internal_CompareQuartetNameEtc(ON_Font const* const* lhs, ON_Font const* const* rhs)
{
  int rc = ON_FontList::CompareQuartetName(lhs, rhs);
  if (0 != rc)
    return rc;

  rc = ON_FontList::CompareWeightStretchStyle(lhs, rhs);
  if (0 != rc)
    return rc;

  rc = ON_FontList::CompareUnderlinedStrikethroughPointSize(lhs, rhs);
  if (0 != rc)
    return rc;

  return ON_FontList::CompareFontCharacteristicsHash(lhs, rhs);
}